

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O0

handle pybind11::detail::
       eigen_map_caster<Eigen::Ref<Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>
       ::cast(Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *src,
             return_value_policy policy,handle parent)

{
  handle local_48;
  PyObject *local_40;
  PyObject *local_38;
  handle local_30;
  return_value_policy local_21;
  Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *pRStack_20;
  return_value_policy policy_local;
  Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *src_local;
  handle parent_local;
  
  local_21 = policy;
  pRStack_20 = src;
  src_local = (Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *)
              parent.m_ptr;
  switch(policy) {
  case automatic:
  case automatic_reference:
  case reference:
    none::none((none *)&local_48);
    local_40 = local_48.m_ptr;
    parent_local = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>,0,Eigen::OuterStride<_1>>>>
                             (src,local_48,true);
    none::~none((none *)&local_48);
    break;
  default:
    pybind11_fail("Invalid return_value_policy for Eigen Map/Ref/Block type");
  case copy:
    memset(&local_30,0,8);
    handle::handle(&local_30);
    parent_local = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>,0,Eigen::OuterStride<_1>>>>
                             (src,local_30,true);
    break;
  case reference_internal:
    local_38 = parent.m_ptr;
    parent_local = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>,0,Eigen::OuterStride<_1>>>>
                             (src,parent,true);
  }
  return (handle)parent_local.m_ptr;
}

Assistant:

static handle cast(const MapType &src, return_value_policy policy, handle parent) {
        switch (policy) {
            case return_value_policy::copy:
                return eigen_array_cast<props>(src);
            case return_value_policy::reference_internal:
                return eigen_array_cast<props>(src, parent, is_eigen_mutable_map<MapType>::value);
            case return_value_policy::reference:
            case return_value_policy::automatic:
            case return_value_policy::automatic_reference:
                return eigen_array_cast<props>(src, none(), is_eigen_mutable_map<MapType>::value);
            default:
                // move, take_ownership don't make any sense for a ref/map:
                pybind11_fail("Invalid return_value_policy for Eigen Map/Ref/Block type");
        }
    }